

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContentSpecNode.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::ContentSpecNode::ContentSpecNode(ContentSpecNode *this,ContentSpecNode *toCopy)

{
  MemoryManager *manager;
  QName *qname;
  ContentSpecNode *pCVar1;
  QName *this_00;
  ContentSpecNode *pCVar2;
  
  (this->super_XSerializable)._vptr_XSerializable = (_func_int **)&PTR__ContentSpecNode_00418e30;
  manager = toCopy->fMemoryManager;
  this->fMemoryManager = manager;
  this->fElement = (QName *)0x0;
  this->fElementDecl = toCopy->fElementDecl;
  this->fFirst = (ContentSpecNode *)0x0;
  this->fSecond = (ContentSpecNode *)0x0;
  this->fType = toCopy->fType;
  this->fAdoptFirst = true;
  this->fAdoptSecond = true;
  this->fMinOccurs = toCopy->fMinOccurs;
  this->fMaxOccurs = toCopy->fMaxOccurs;
  qname = toCopy->fElement;
  if (qname != (QName *)0x0) {
    this_00 = (QName *)XMemory::operator_new(0x48,manager);
    QName::QName(this_00,qname);
    this->fElement = this_00;
  }
  pCVar1 = toCopy->fFirst;
  if (pCVar1 != (ContentSpecNode *)0x0) {
    pCVar2 = (ContentSpecNode *)XMemory::operator_new(0x40,this->fMemoryManager);
    ContentSpecNode(pCVar2,pCVar1);
    this->fFirst = pCVar2;
  }
  pCVar1 = toCopy->fSecond;
  if (pCVar1 != (ContentSpecNode *)0x0) {
    pCVar2 = (ContentSpecNode *)XMemory::operator_new(0x40,this->fMemoryManager);
    ContentSpecNode(pCVar2,pCVar1);
    this->fSecond = pCVar2;
  }
  return;
}

Assistant:

ContentSpecNode::ContentSpecNode(const ContentSpecNode& toCopy) :
    XSerializable(toCopy)
    , XMemory(toCopy)
    , fMemoryManager(toCopy.fMemoryManager)
    , fElement(0)
    , fElementDecl(toCopy.fElementDecl)
    , fFirst(0)
    , fSecond(0)
    , fType(toCopy.fType)
    , fAdoptFirst(true)
    , fAdoptSecond(true)
    , fMinOccurs(toCopy.fMinOccurs)
    , fMaxOccurs(toCopy.fMaxOccurs)
{
    try
    {
        const QName* tempElement = toCopy.getElement();
        if (tempElement)
            fElement = new (fMemoryManager) QName(*tempElement);

        const ContentSpecNode *tmp = toCopy.getFirst();
        if (tmp)
            fFirst = new (fMemoryManager) ContentSpecNode(*tmp);

        tmp = toCopy.getSecond();
        if (tmp)
            fSecond = new (fMemoryManager) ContentSpecNode(*tmp);
    }
    catch (const OutOfMemoryException&)
    {
        cleanup();

        throw;
    }

}